

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O0

bool IR::IsTypeCheckBailOutKind(BailOutKind kind)

{
  BailOutKind BVar1;
  undefined1 local_11;
  BailOutKind kindWithoutBits;
  BailOutKind kind_local;
  
  BVar1 = operator~(BailOutKindBits);
  BVar1 = operator&(kind,BVar1);
  local_11 = true;
  if (((BVar1 != BailOutFailedTypeCheck) &&
      (local_11 = true, BVar1 != BailOutFailedFixedFieldTypeCheck)) &&
     (local_11 = true, BVar1 != BailOutFailedEquivalentTypeCheck)) {
    local_11 = BVar1 == BailOutFailedEquivalentFixedFieldTypeCheck;
  }
  return local_11;
}

Assistant:

bool IR::IsTypeCheckBailOutKind(IR::BailOutKind kind)
{
    IR::BailOutKind kindWithoutBits = kind & ~IR::BailOutKindBits;
    return
        kindWithoutBits == IR::BailOutFailedTypeCheck ||
        kindWithoutBits == IR::BailOutFailedFixedFieldTypeCheck ||
        kindWithoutBits == IR::BailOutFailedEquivalentTypeCheck ||
        kindWithoutBits == IR::BailOutFailedEquivalentFixedFieldTypeCheck;
}